

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

int AF_AActor_TeleportMove
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *thing;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  char *pcVar5;
  bool bVar6;
  DVector3 local_48;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      thing = (AActor *)(param->field_0).field_1.a;
      if (thing != (AActor *)0x0) {
        if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
          (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (thing->super_DThinker).super_DObject.Class;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0041598b;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar5 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar5 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar5 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      local_48.X = (double)param[1].field_0.field_1.a;
                      local_48.Y = (double)param[2].field_0.field_1.a;
                      local_48.Z = (double)param[3].field_0.field_1.a;
                      pVVar1 = param + 4;
                      if (numparam == 5) {
                        param = defaultparam->Array;
                        if (param[5].field_0.field_3.Type == '\0') {
LAB_00415869:
                          bVar6 = P_TeleportMove(thing,&local_48,(pVVar1->field_0).i != 0,
                                                 param[5].field_0.i != 0);
                          if (numret < 1) {
                            iVar3 = 0;
                          }
                          else {
                            if (ret == (VMReturn *)0x0) {
                              __assert_fail("ret != NULL",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                            ,0x1ce,
                                            "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            if (ret->RegType != '\0') {
                              __assert_fail("RegType == REGT_INT",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                            ,0x13f,"void VMReturn::SetInt(int)");
                            }
                            *(uint *)ret->Location = (uint)bVar6;
                            iVar3 = 1;
                          }
                          return iVar3;
                        }
                        pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') goto LAB_00415869;
                        pcVar5 = "(param[paramnum]).Type == REGT_INT";
                      }
                      __assert_fail(pcVar5,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                    ,0x1cd,
                                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar5 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                ,0x1cc,
                                "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar5 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                            ,0x1cb,
                            "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar5 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x1ca,
                        "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar5 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x1c9,
                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0041598b:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x1c8,
                "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TeleportMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(telefrag);
	PARAM_BOOL_DEF(modify);
	ACTION_RETURN_BOOL(P_TeleportMove(self, DVector3(x, y, z), telefrag, modify));
}